

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckExtraSpaces.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckExtraSpaces(Parser *this,unsigned_long max,bool checkEmptyLines)

{
  string *psVar1;
  char cVar2;
  pointer pcVar3;
  byte bVar4;
  char *__s;
  size_t pos;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  Error error;
  char localval [21];
  
  this->m_TestsDone[0xb] = true;
  __s = (char *)operator_new__(0xff);
  bVar4 = 0;
  snprintf(__s,0xff,"Spaces at the end of line = %ld max spaces",max);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0xb));
  operator_delete__(__s);
  psVar1 = &this->m_Buffer;
  pos = std::__cxx11::string::find((char *)psVar1,0x1554d1);
  do {
    if (pos == 0xffffffffffffffff) {
      return (bool)(~bVar4 & 1);
    }
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    sVar5 = pos;
    if (checkEmptyLines) {
LAB_001457e0:
      sVar5 = pos;
      uVar7 = 0xffffffffffffffff;
      do {
        uVar6 = uVar7;
        if (((long)sVar5 < 1) || (pcVar3[sVar5 - 1] != ' ')) goto LAB_001458e6;
        uVar7 = uVar6 + 1;
        sVar5 = sVar5 - 1;
      } while (uVar7 < max);
      error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
      error.description._M_string_length = 0;
      error.description.field_2._M_local_buf[0] = '\0';
      error.line = GetLineNumber(this,pos,false);
      error.number = 0xb;
      error.line2 = error.line;
      std::__cxx11::string::assign((char *)&error.description);
      snprintf(localval,0x15,"%ld",uVar6 + 2);
      std::__cxx11::string::append((char *)&error.description);
      std::__cxx11::string::append((char *)&error.description);
      snprintf(localval,0x15,"%ld",max);
      std::__cxx11::string::append((char *)&error.description);
      std::__cxx11::string::append((char *)&error.description);
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,&error);
      std::__cxx11::string::~string((string *)&error.description);
      bVar4 = 1;
    }
    else {
      do {
        if ((long)sVar5 < 2) goto LAB_001458e6;
        cVar2 = pcVar3[sVar5 - 1];
        sVar5 = sVar5 - 1;
      } while (cVar2 == ' ');
      if (cVar2 != '\n') goto LAB_001457e0;
    }
LAB_001458e6:
    pos = std::__cxx11::string::find((char *)psVar1,0x1554d1);
  } while( true );
}

Assistant:

bool Parser::CheckExtraSpaces(unsigned long max,bool checkEmptyLines)
{
  m_TestsDone[SPACES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Spaces at the end of line = %ld max spaces",max);
  m_TestsDescription[SPACES] = val;
  delete [] val;

  bool hasError = false;
  auto posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n", 0));
  while(posEndOfLine != -1)
    {
    bool checking = true;
    if(!checkEmptyLines)
      {
      // Check if the line is empty
      long pos = posEndOfLine-1;
      bool empty = true;
      while(pos>0 && m_Buffer[pos]!='\n')
        {
        if(m_Buffer[pos] != ' ')
          {
          empty = false;
          break;
          }
        pos--;
        }

      if(empty)
        {
        checking = false;
        }
      }

     if(checking)
     {
      // We try to find the word before that
      long i=posEndOfLine-1;
      unsigned long space = 0;
      while(i>=0)
        {
        if(m_Buffer[i] == ' ')
          {
          space++;
          if(space > max)
            {
            Error error;
            error.line = this->GetLineNumber(posEndOfLine);
            error.line2 = error.line;
            error.number = SPACES;
            error.description = "Number of spaces before end of line exceed: ";
            constexpr size_t length = 21;
            char localval[length];
            snprintf(localval,length,"%ld",space);
            error.description += localval;
            error.description += " (max=";
            snprintf(localval,length,"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            break; // avoid multiple error line
            }
          }
        else
          {
          break;
          }
        i--;
        }
      }
    posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n",posEndOfLine+1));
    }

  return !hasError;
}